

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O1

void __thiscall Token::removeBrace(Token *this,char open,char close)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  
  uVar4 = std::__cxx11::string::find((char)this,CONCAT71(in_register_00000031,open));
  do {
    if (uVar4 == 0xffffffffffffffff) {
      return;
    }
    uVar3 = (this->content)._M_string_length;
    uVar6 = 0xffffffffffffffff;
    if (uVar4 + 1 < uVar3) {
      iVar5 = 1;
      uVar6 = uVar4;
      do {
        cVar2 = (this->content)._M_dataplus._M_p[uVar6 + 1];
        iVar5 = (iVar5 + (uint)(cVar2 == open)) - (uint)(cVar2 == close);
        uVar1 = uVar6 + 2;
        uVar6 = uVar6 + 1;
        if (uVar3 <= uVar1) break;
      } while (0 < iVar5);
      if (0 < iVar5) {
        uVar6 = 0xffffffffffffffff;
      }
    }
    if (uVar6 == 0xffffffffffffffff) {
      return;
    }
    std::__cxx11::string::erase((ulong)this,uVar4);
    uVar4 = std::__cxx11::string::find((char)this,(ulong)(uint)(int)open);
  } while( true );
}

Assistant:

void removeBrace(char open, char close) {
        size_t start = content.find(open);
        while (start != std::string::npos) {
            const size_t end = braceEnd(content, start, open, close);
            if (end == std::string::npos) {
                return;
            }

            content.erase(start, end - start + 1);

            start = content.find(open);
        }
    }